

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_impl.h
# Opt level: O1

void secp256k1_ecmult_table_get_ge_storage(secp256k1_ge *r,secp256k1_ge_storage *pre,int n,int w)

{
  secp256k1_fe *psVar1;
  uint64_t *puVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  uint64_t uVar175;
  uint64_t uVar176;
  uint64_t uVar177;
  int iVar178;
  ulong uVar179;
  undefined4 in_register_0000000c;
  secp256k1_gej *a;
  secp256k1_ge *a_00;
  secp256k1_ge *unaff_RBX;
  ulong uVar180;
  ulong uVar181;
  secp256k1_gej *r_00;
  secp256k1_gej *a_01;
  ulong uVar182;
  ulong uVar183;
  ulong uVar184;
  ulong uVar185;
  undefined1 auStack_270 [104];
  ulong uStack_208;
  ulong uStack_200;
  ulong uStack_1f8;
  ulong uStack_1f0;
  ulong uStack_1e8;
  undefined1 auStack_1e0 [56];
  uint64_t uStack_1a8;
  uint64_t uStack_1a0;
  uint64_t uStack_198;
  uint64_t uStack_190;
  int iStack_188;
  undefined1 auStack_180 [56];
  uint64_t uStack_148;
  uint64_t uStack_140;
  uint64_t uStack_138;
  uint64_t uStack_130;
  int iStack_128;
  int iStack_124;
  ulong uStack_120;
  ulong uStack_118;
  undefined1 auStack_110 [144];
  ulong uStack_80;
  ulong uStack_78;
  ulong uStack_70;
  ulong uStack_68;
  uint64_t uStack_60;
  int iStack_58;
  int iStack_54;
  secp256k1_ge *psStack_48;
  
  a = (secp256k1_gej *)CONCAT44(in_register_0000000c,w);
  if ((n & 1U) == 0) {
    secp256k1_ecmult_table_get_ge_storage_cold_4();
    r_00 = (secp256k1_gej *)r;
LAB_0012147c:
    secp256k1_ecmult_table_get_ge_storage_cold_3();
LAB_00121481:
    secp256k1_ecmult_table_get_ge_storage_cold_2();
  }
  else {
    r_00 = (secp256k1_gej *)r;
    if (n < -7) goto LAB_0012147c;
    if (7 < n) goto LAB_00121481;
    if (0 < n) {
      secp256k1_ge_from_storage(r,pre + (n - 1U >> 1));
      return;
    }
    pre = pre + ((uint)~n >> 1);
    secp256k1_ge_from_storage(r,pre);
    psVar1 = &r->y;
    r_00 = (secp256k1_gej *)psVar1;
    secp256k1_fe_verify(psVar1);
    unaff_RBX = r;
    if ((r->y).magnitude < 2) {
      uVar175 = (r->y).n[1];
      uVar176 = (r->y).n[2];
      uVar177 = (r->y).n[3];
      (r->y).n[0] = 0x3ffffbfffff0bc - (r->y).n[0];
      (r->y).n[1] = 0x3ffffffffffffc - uVar175;
      (r->y).n[2] = 0x3ffffffffffffc - uVar176;
      (r->y).n[3] = 0x3ffffffffffffc - uVar177;
      (r->y).n[4] = 0x3fffffffffffc - (r->y).n[4];
      (r->y).magnitude = 2;
      (r->y).normalized = 0;
      secp256k1_fe_verify(psVar1);
      return;
    }
  }
  secp256k1_ecmult_table_get_ge_storage_cold_1();
  psStack_48 = unaff_RBX;
  secp256k1_ge_verify(a_00);
  secp256k1_fe_verify(&a->x);
  if (((secp256k1_gej *)pre)->infinity == 0) {
    if (a_00->infinity != 0) {
      memcpy(r_00,pre,0x98);
      return;
    }
    a_01 = (secp256k1_gej *)(auStack_110 + 0x60);
    secp256k1_fe_mul((secp256k1_fe *)a_01,&((secp256k1_gej *)pre)->z,&a->x);
    secp256k1_fe_verify((secp256k1_fe *)a_01);
    if (8 < (int)auStack_110._136_4_) goto LAB_001226f9;
    auVar23._8_8_ = 0;
    auVar23._0_8_ = auStack_110._96_8_ * 2;
    auVar99._8_8_ = 0;
    auVar99._0_8_ = auStack_110._120_8_;
    auVar24._8_8_ = 0;
    auVar24._0_8_ = auStack_110._104_8_ * 2;
    auVar100._8_8_ = 0;
    auVar100._0_8_ = auStack_110._112_8_;
    auVar25._8_8_ = 0;
    auVar25._0_8_ = auStack_110._128_8_;
    auVar101._8_8_ = 0;
    auVar101._0_8_ = auStack_110._128_8_;
    uVar183 = SUB168(auVar25 * auVar101,0);
    auVar26._8_8_ = 0;
    auVar26._0_8_ = uVar183 & 0xfffffffffffff;
    auVar23 = auVar24 * auVar100 + auVar23 * auVar99 + auVar26 * ZEXT816(0x1000003d10);
    uVar181 = auVar23._0_8_;
    auStack_180._0_8_ = uVar181 & 0xfffffffffffff;
    auVar154._8_8_ = 0;
    auVar154._0_8_ = uVar181 >> 0x34 | auVar23._8_8_ << 0xc;
    uVar181 = auStack_110._128_8_ * 2;
    auVar27._8_8_ = 0;
    auVar27._0_8_ = auStack_110._96_8_;
    auVar102._8_8_ = 0;
    auVar102._0_8_ = uVar181;
    auVar28._8_8_ = 0;
    auVar28._0_8_ = auStack_110._104_8_ * 2;
    auVar103._8_8_ = 0;
    auVar103._0_8_ = auStack_110._120_8_;
    auVar29._8_8_ = 0;
    auVar29._0_8_ = auStack_110._112_8_;
    auVar104._8_8_ = 0;
    auVar104._0_8_ = auStack_110._112_8_;
    auVar30._8_8_ = 0;
    auVar30._0_8_ = uVar183 >> 0x34 | SUB168(auVar25 * auVar101,8) << 0xc;
    auVar23 = auVar27 * auVar102 + auVar154 + auVar28 * auVar103 + auVar29 * auVar104 +
              auVar30 * ZEXT816(0x1000003d10);
    auStack_1e0._48_8_ = auVar23._0_8_;
    auVar155._8_8_ = 0;
    auVar155._0_8_ = (ulong)auStack_1e0._48_8_ >> 0x34 | auVar23._8_8_ << 0xc;
    auStack_1e0._0_8_ = (auStack_1e0._48_8_ & 0xfffffffffffff) >> 0x30;
    auStack_1e0._48_8_ = auStack_1e0._48_8_ & 0xffffffffffff;
    auVar31._8_8_ = 0;
    auVar31._0_8_ = auStack_110._96_8_;
    auVar105._8_8_ = 0;
    auVar105._0_8_ = auStack_110._96_8_;
    auVar32._8_8_ = 0;
    auVar32._0_8_ = auStack_110._104_8_;
    auVar106._8_8_ = 0;
    auVar106._0_8_ = uVar181;
    auVar33._8_8_ = 0;
    auVar33._0_8_ = auStack_110._112_8_ * 2;
    auVar107._8_8_ = 0;
    auVar107._0_8_ = auStack_110._120_8_;
    auVar23 = auVar32 * auVar106 + auVar155 + auVar33 * auVar107;
    uVar183 = auVar23._0_8_;
    auVar157._8_8_ = 0;
    auVar157._0_8_ = uVar183 >> 0x34 | auVar23._8_8_ << 0xc;
    auVar108._8_8_ = 0;
    auVar108._0_8_ = (uVar183 & 0xfffffffffffff) << 4 | auStack_1e0._0_8_;
    auVar23 = auVar31 * auVar105 + ZEXT816(0x1000003d1) * auVar108;
    uVar183 = auVar23._0_8_;
    auStack_110._48_8_ = uVar183 & 0xfffffffffffff;
    auVar156._8_8_ = 0;
    auVar156._0_8_ = uVar183 >> 0x34 | auVar23._8_8_ << 0xc;
    auVar34._8_8_ = 0;
    auVar34._0_8_ = auStack_110._96_8_ * 2;
    auVar109._8_8_ = 0;
    auVar109._0_8_ = auStack_110._104_8_;
    auVar35._8_8_ = 0;
    auVar35._0_8_ = auStack_110._112_8_;
    auVar110._8_8_ = 0;
    auVar110._0_8_ = uVar181;
    auVar36._8_8_ = 0;
    auVar36._0_8_ = auStack_110._120_8_;
    auVar111._8_8_ = 0;
    auVar111._0_8_ = auStack_110._120_8_;
    auVar24 = auVar35 * auVar110 + auVar157 + auVar36 * auVar111;
    uVar183 = auVar24._0_8_;
    auVar37._8_8_ = 0;
    auVar37._0_8_ = uVar183 & 0xfffffffffffff;
    auVar23 = auVar34 * auVar109 + auVar156 + auVar37 * ZEXT816(0x1000003d10);
    uVar184 = auVar23._0_8_;
    auVar159._8_8_ = 0;
    auVar159._0_8_ = uVar183 >> 0x34 | auVar24._8_8_ << 0xc;
    auStack_110._56_8_ = uVar184 & 0xfffffffffffff;
    auVar158._8_8_ = 0;
    auVar158._0_8_ = uVar184 >> 0x34 | auVar23._8_8_ << 0xc;
    auVar38._8_8_ = 0;
    auVar38._0_8_ = auStack_110._96_8_ * 2;
    auVar112._8_8_ = 0;
    auVar112._0_8_ = auStack_110._112_8_;
    auVar39._8_8_ = 0;
    auVar39._0_8_ = auStack_110._104_8_;
    auVar113._8_8_ = 0;
    auVar113._0_8_ = auStack_110._104_8_;
    auVar40._8_8_ = 0;
    auVar40._0_8_ = auStack_110._120_8_;
    auVar114._8_8_ = 0;
    auVar114._0_8_ = uVar181;
    auVar159 = auVar40 * auVar114 + auVar159;
    uVar181 = auVar159._0_8_;
    auVar41._8_8_ = 0;
    auVar41._0_8_ = uVar181 & 0xfffffffffffff;
    auVar23 = auVar38 * auVar112 + auVar158 + auVar39 * auVar113 + auVar41 * ZEXT816(0x1000003d10);
    uVar183 = auVar23._0_8_;
    auStack_110._64_8_ = uVar183 & 0xfffffffffffff;
    auVar160._8_8_ = 0;
    auVar160._0_8_ = (uVar183 >> 0x34 | auVar23._8_8_ << 0xc) + auStack_180._0_8_;
    auVar42._8_8_ = 0;
    auVar42._0_8_ = uVar181 >> 0x34 | auVar159._8_8_ << 0xc;
    auVar160 = auVar42 * ZEXT816(0x1000003d10) + auVar160;
    uVar181 = auVar160._0_8_;
    auStack_110._72_8_ = uVar181 & 0xfffffffffffff;
    auStack_110._80_8_ = (uVar181 >> 0x34 | auVar160._8_8_ << 0xc) + auStack_1e0._48_8_;
    auStack_110._88_4_ = 1;
    auStack_110._92_4_ = 0;
    secp256k1_fe_verify((secp256k1_fe *)(auStack_110 + 0x30));
    auStack_180._0_8_ = (((secp256k1_gej *)pre)->x).n[0];
    auStack_180._8_8_ = (((secp256k1_gej *)pre)->x).n[1];
    auStack_180._16_8_ = (((secp256k1_gej *)pre)->x).n[2];
    auStack_180._24_8_ = (((secp256k1_gej *)pre)->x).n[3];
    auStack_180._32_8_ = (((secp256k1_gej *)pre)->x).n[4];
    auStack_180._40_4_ = (((secp256k1_gej *)pre)->x).magnitude;
    auStack_180._44_4_ = (((secp256k1_gej *)pre)->x).normalized;
    a_01 = (secp256k1_gej *)auStack_180;
    secp256k1_fe_verify((secp256k1_fe *)a_01);
    uVar181 = ((ulong)auStack_180._32_8_ >> 0x30) * 0x1000003d1 + auStack_180._0_8_;
    uVar183 = (uVar181 >> 0x34) + auStack_180._8_8_;
    uVar184 = (uVar183 >> 0x34) + auStack_180._16_8_;
    uVar182 = (uVar184 >> 0x34) + auStack_180._24_8_;
    auStack_180._24_8_ = uVar182 & 0xfffffffffffff;
    auStack_180._32_8_ = (uVar182 >> 0x34) + (auStack_180._32_8_ & 0xffffffffffff);
    auStack_180._16_8_ = uVar184 & 0xfffffffffffff;
    auStack_180._8_8_ = uVar183 & 0xfffffffffffff;
    auStack_180._0_8_ = uVar181 & 0xfffffffffffff;
    auStack_180._40_4_ = 1;
    secp256k1_fe_verify((secp256k1_fe *)a_01);
    secp256k1_fe_mul((secp256k1_fe *)(auStack_1e0 + 0x30),&a_00->x,
                     (secp256k1_fe *)(auStack_110 + 0x30));
    auStack_1e0._0_8_ = (((secp256k1_gej *)pre)->y).n[0];
    auStack_1e0._8_8_ = (((secp256k1_gej *)pre)->y).n[1];
    auStack_1e0._16_8_ = (((secp256k1_gej *)pre)->y).n[2];
    auStack_1e0._24_8_ = (((secp256k1_gej *)pre)->y).n[3];
    auStack_1e0._32_8_ = (((secp256k1_gej *)pre)->y).n[4];
    auStack_1e0._40_4_ = (((secp256k1_gej *)pre)->y).magnitude;
    auStack_1e0._44_4_ = (((secp256k1_gej *)pre)->y).normalized;
    secp256k1_fe_verify((secp256k1_fe *)auStack_1e0);
    uVar181 = ((ulong)auStack_1e0._32_8_ >> 0x30) * 0x1000003d1 + auStack_1e0._0_8_;
    uVar183 = (uVar181 >> 0x34) + auStack_1e0._8_8_;
    uVar184 = (uVar183 >> 0x34) + auStack_1e0._16_8_;
    uVar182 = (uVar184 >> 0x34) + auStack_1e0._24_8_;
    auStack_1e0._24_8_ = uVar182 & 0xfffffffffffff;
    auStack_1e0._32_8_ = (uVar182 >> 0x34) + (auStack_1e0._32_8_ & 0xffffffffffff);
    auStack_1e0._16_8_ = uVar184 & 0xfffffffffffff;
    auStack_1e0._8_8_ = uVar183 & 0xfffffffffffff;
    auStack_1e0._0_8_ = uVar181 & 0xfffffffffffff;
    auStack_1e0._40_4_ = 1;
    secp256k1_fe_verify((secp256k1_fe *)auStack_1e0);
    secp256k1_fe_mul((secp256k1_fe *)auStack_110,&a_00->y,(secp256k1_fe *)(auStack_110 + 0x30));
    secp256k1_fe_mul((secp256k1_fe *)auStack_110,(secp256k1_fe *)auStack_110,
                     (secp256k1_fe *)(auStack_110 + 0x60));
    secp256k1_fe_verify((secp256k1_fe *)a_01);
    if (1 < (int)auStack_180._40_4_) goto LAB_001226fe;
    auStack_270._96_8_ = 0x3ffffbfffff0bc - auStack_180._0_8_;
    uStack_208 = 0x3ffffffffffffc - auStack_180._8_8_;
    uStack_200 = 0x3ffffffffffffc - auStack_180._16_8_;
    uStack_1f8 = 0x3ffffffffffffc - auStack_180._24_8_;
    uStack_1f0 = 0x3fffffffffffc - auStack_180._32_8_;
    uStack_1e8 = 2;
    secp256k1_fe_verify((secp256k1_fe *)(auStack_270 + 0x60));
    secp256k1_fe_verify((secp256k1_fe *)(auStack_270 + 0x60));
    a_01 = (secp256k1_gej *)(auStack_1e0 + 0x30);
    secp256k1_fe_verify((secp256k1_fe *)a_01);
    if (0x20 < iStack_188 + (int)uStack_1e8) goto LAB_00122703;
    auStack_270._96_8_ = auStack_270._96_8_ + auStack_1e0._48_8_;
    uStack_208 = uStack_208 + uStack_1a8;
    uStack_200 = uStack_200 + uStack_1a0;
    uStack_1f8 = uStack_1f8 + uStack_198;
    uStack_1f0 = uStack_1f0 + uStack_190;
    uStack_1e8 = (ulong)(uint)(iStack_188 + (int)uStack_1e8);
    secp256k1_fe_verify((secp256k1_fe *)(auStack_270 + 0x60));
    a_01 = (secp256k1_gej *)auStack_110;
    secp256k1_fe_verify((secp256k1_fe *)a_01);
    if (1 < (int)auStack_110._40_4_) goto LAB_00122708;
    auStack_270._48_8_ = 0x3ffffbfffff0bc - auStack_110._0_8_;
    auStack_270._56_8_ = 0x3ffffffffffffc - auStack_110._8_8_;
    auStack_270._64_8_ = 0x3ffffffffffffc - auStack_110._16_8_;
    auStack_270._72_8_ = 0x3ffffffffffffc - auStack_110._24_8_;
    auStack_270._80_8_ = 0x3fffffffffffc - auStack_110._32_8_;
    auStack_270._88_8_ = 2;
    secp256k1_fe_verify((secp256k1_fe *)(auStack_270 + 0x30));
    secp256k1_fe_verify((secp256k1_fe *)(auStack_270 + 0x30));
    a_01 = (secp256k1_gej *)auStack_1e0;
    secp256k1_fe_verify((secp256k1_fe *)a_01);
    if (0x20 < (int)(auStack_1e0._40_4_ + auStack_270._88_4_)) goto LAB_0012270d;
    auStack_270._48_8_ = auStack_270._48_8_ + auStack_1e0._0_8_;
    auStack_270._56_8_ = auStack_270._56_8_ + auStack_1e0._8_8_;
    auStack_270._64_8_ = auStack_270._64_8_ + auStack_1e0._16_8_;
    auStack_270._72_8_ = auStack_270._72_8_ + auStack_1e0._24_8_;
    auStack_270._80_8_ = auStack_270._80_8_ + auStack_1e0._32_8_;
    auStack_270._92_4_ = 0;
    auStack_270._88_4_ = auStack_1e0._40_4_ + auStack_270._88_4_;
    secp256k1_fe_verify((secp256k1_fe *)(auStack_270 + 0x30));
    secp256k1_fe_verify((secp256k1_fe *)(auStack_270 + 0x60));
    uVar181 = (uStack_1f0 >> 0x30) * 0x1000003d1 + auStack_270._96_8_;
    if (((uVar181 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar181 & 0xfffffffffffff) == 0)) {
      uVar183 = (uVar181 >> 0x34) + uStack_208;
      uVar184 = (uVar183 >> 0x34) + uStack_200;
      uVar182 = (uVar184 >> 0x34) + uStack_1f8;
      uVar185 = (uVar182 >> 0x34) + (uStack_1f0 & 0xffffffffffff);
      if ((((uVar183 | uVar181 | uVar184 | uVar182) & 0xfffffffffffff) == 0 && uVar185 == 0) ||
         ((uVar181 + 0x1000003d0 & uVar183 & uVar184 & uVar182 & (uVar185 ^ 0xf000000000000)) ==
          0xfffffffffffff)) {
        secp256k1_fe_verify((secp256k1_fe *)(auStack_270 + 0x30));
        uVar181 = ((ulong)auStack_270._80_8_ >> 0x30) * 0x1000003d1 + auStack_270._48_8_;
        if (((uVar181 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar181 & 0xfffffffffffff) == 0))
        {
          uVar183 = (uVar181 >> 0x34) + auStack_270._56_8_;
          uVar184 = (uVar183 >> 0x34) + auStack_270._64_8_;
          uVar182 = (uVar184 >> 0x34) + auStack_270._72_8_;
          uVar185 = (uVar182 >> 0x34) + (auStack_270._80_8_ & 0xffffffffffff);
          if ((((uVar183 | uVar181 | uVar184 | uVar182) & 0xfffffffffffff) == 0 && uVar185 == 0) ||
             ((uVar181 + 0x1000003d0 & uVar183 & uVar184 & uVar182 & (uVar185 ^ 0xf000000000000)) ==
              0xfffffffffffff)) {
            secp256k1_gej_double_var(r_00,(secp256k1_gej *)pre,(secp256k1_fe *)0x0);
            return;
          }
        }
        secp256k1_gej_set_infinity(r_00);
        return;
      }
    }
    r_00->infinity = 0;
    a_01 = (secp256k1_gej *)(auStack_270 + 0x60);
    secp256k1_fe_mul(&r_00->z,&((secp256k1_gej *)pre)->z,(secp256k1_fe *)a_01);
    secp256k1_fe_verify((secp256k1_fe *)a_01);
    if (8 < (int)uStack_1e8) goto LAB_00122712;
    a_01 = (secp256k1_gej *)&stack0xffffffffffffff80;
    auVar43._8_8_ = 0;
    auVar43._0_8_ = auStack_270._96_8_ * 2;
    auVar115._8_8_ = 0;
    auVar115._0_8_ = uStack_1f8;
    auVar44._8_8_ = 0;
    auVar44._0_8_ = uStack_208 * 2;
    auVar116._8_8_ = 0;
    auVar116._0_8_ = uStack_200;
    auVar45._8_8_ = 0;
    auVar45._0_8_ = uStack_1f0;
    auVar117._8_8_ = 0;
    auVar117._0_8_ = uStack_1f0;
    uVar183 = SUB168(auVar45 * auVar117,0);
    auVar46._8_8_ = 0;
    auVar46._0_8_ = uVar183 & 0xfffffffffffff;
    auVar23 = auVar44 * auVar116 + auVar43 * auVar115 + auVar46 * ZEXT816(0x1000003d10);
    uVar181 = auVar23._0_8_;
    auStack_270._0_8_ = uVar181 & 0xfffffffffffff;
    auVar161._8_8_ = 0;
    auVar161._0_8_ = uVar181 >> 0x34 | auVar23._8_8_ << 0xc;
    uVar181 = uStack_1f0 * 2;
    auVar47._8_8_ = 0;
    auVar47._0_8_ = auStack_270._96_8_;
    auVar118._8_8_ = 0;
    auVar118._0_8_ = uVar181;
    auVar48._8_8_ = 0;
    auVar48._0_8_ = uStack_208 * 2;
    auVar119._8_8_ = 0;
    auVar119._0_8_ = uStack_1f8;
    auVar49._8_8_ = 0;
    auVar49._0_8_ = uStack_200;
    auVar120._8_8_ = 0;
    auVar120._0_8_ = uStack_200;
    auVar50._8_8_ = 0;
    auVar50._0_8_ = uVar183 >> 0x34 | SUB168(auVar45 * auVar117,8) << 0xc;
    auVar23 = auVar47 * auVar118 + auVar161 + auVar48 * auVar119 + auVar49 * auVar120 +
              auVar50 * ZEXT816(0x1000003d10);
    uVar183 = auVar23._0_8_;
    auVar162._8_8_ = 0;
    auVar162._0_8_ = uVar183 >> 0x34 | auVar23._8_8_ << 0xc;
    auStack_180._48_8_ = uVar183 & 0xffffffffffff;
    auVar51._8_8_ = 0;
    auVar51._0_8_ = auStack_270._96_8_;
    auVar121._8_8_ = 0;
    auVar121._0_8_ = auStack_270._96_8_;
    auVar52._8_8_ = 0;
    auVar52._0_8_ = uStack_208;
    auVar122._8_8_ = 0;
    auVar122._0_8_ = uVar181;
    auVar53._8_8_ = 0;
    auVar53._0_8_ = uStack_200 * 2;
    auVar123._8_8_ = 0;
    auVar123._0_8_ = uStack_1f8;
    auVar23 = auVar52 * auVar122 + auVar162 + auVar53 * auVar123;
    uVar184 = auVar23._0_8_;
    auVar164._8_8_ = 0;
    auVar164._0_8_ = uVar184 >> 0x34 | auVar23._8_8_ << 0xc;
    auVar124._8_8_ = 0;
    auVar124._0_8_ = (uVar184 & 0xfffffffffffff) << 4 | (uVar183 & 0xfffffffffffff) >> 0x30;
    auVar23 = auVar51 * auVar121 + ZEXT816(0x1000003d1) * auVar124;
    uVar183 = auVar23._0_8_;
    uStack_80 = uVar183 & 0xfffffffffffff;
    auVar163._8_8_ = 0;
    auVar163._0_8_ = uVar183 >> 0x34 | auVar23._8_8_ << 0xc;
    auVar54._8_8_ = 0;
    auVar54._0_8_ = auStack_270._96_8_ * 2;
    auVar125._8_8_ = 0;
    auVar125._0_8_ = uStack_208;
    auVar55._8_8_ = 0;
    auVar55._0_8_ = uStack_200;
    auVar126._8_8_ = 0;
    auVar126._0_8_ = uVar181;
    auVar56._8_8_ = 0;
    auVar56._0_8_ = uStack_1f8;
    auVar127._8_8_ = 0;
    auVar127._0_8_ = uStack_1f8;
    auVar24 = auVar55 * auVar126 + auVar164 + auVar56 * auVar127;
    uVar183 = auVar24._0_8_;
    auVar57._8_8_ = 0;
    auVar57._0_8_ = uVar183 & 0xfffffffffffff;
    auVar23 = auVar54 * auVar125 + auVar163 + auVar57 * ZEXT816(0x1000003d10);
    uVar184 = auVar23._0_8_;
    auVar166._8_8_ = 0;
    auVar166._0_8_ = uVar183 >> 0x34 | auVar24._8_8_ << 0xc;
    uStack_78 = uVar184 & 0xfffffffffffff;
    auVar165._8_8_ = 0;
    auVar165._0_8_ = uVar184 >> 0x34 | auVar23._8_8_ << 0xc;
    auVar58._8_8_ = 0;
    auVar58._0_8_ = auStack_270._96_8_ * 2;
    auVar128._8_8_ = 0;
    auVar128._0_8_ = uStack_200;
    auVar59._8_8_ = 0;
    auVar59._0_8_ = uStack_208;
    auVar129._8_8_ = 0;
    auVar129._0_8_ = uStack_208;
    auVar60._8_8_ = 0;
    auVar60._0_8_ = uStack_1f8;
    auVar130._8_8_ = 0;
    auVar130._0_8_ = uVar181;
    auVar166 = auVar60 * auVar130 + auVar166;
    uVar181 = auVar166._0_8_;
    auVar61._8_8_ = 0;
    auVar61._0_8_ = uVar181 & 0xfffffffffffff;
    auVar23 = auVar58 * auVar128 + auVar165 + auVar59 * auVar129 + auVar61 * ZEXT816(0x1000003d10);
    uVar183 = auVar23._0_8_;
    uStack_70 = uVar183 & 0xfffffffffffff;
    auVar167._8_8_ = 0;
    auVar167._0_8_ = (uVar183 >> 0x34 | auVar23._8_8_ << 0xc) + auStack_270._0_8_;
    auVar62._8_8_ = 0;
    auVar62._0_8_ = uVar181 >> 0x34 | auVar166._8_8_ << 0xc;
    auVar167 = auVar62 * ZEXT816(0x1000003d10) + auVar167;
    uVar181 = auVar167._0_8_;
    uStack_68 = uVar181 & 0xfffffffffffff;
    uStack_60 = (uVar181 >> 0x34 | auVar167._8_8_ << 0xc) + auStack_180._48_8_;
    iStack_58 = 1;
    iStack_54 = 0;
    secp256k1_fe_verify((secp256k1_fe *)a_01);
    secp256k1_fe_verify((secp256k1_fe *)a_01);
    if (1 < iStack_58) goto LAB_00122717;
    uStack_80 = 0x3ffffbfffff0bc - uStack_80;
    uStack_78 = 0x3ffffffffffffc - uStack_78;
    uStack_70 = 0x3ffffffffffffc - uStack_70;
    uStack_68 = 0x3ffffffffffffc - uStack_68;
    uStack_60 = 0x3fffffffffffc - uStack_60;
    iStack_58 = 2;
    iStack_54 = 0;
    secp256k1_fe_verify((secp256k1_fe *)&stack0xffffffffffffff80);
    secp256k1_fe_mul((secp256k1_fe *)auStack_270,(secp256k1_fe *)&stack0xffffffffffffff80,
                     (secp256k1_fe *)(auStack_270 + 0x60));
    secp256k1_fe_mul((secp256k1_fe *)(auStack_180 + 0x30),(secp256k1_fe *)auStack_180,
                     (secp256k1_fe *)&stack0xffffffffffffff80);
    secp256k1_fe_verify((secp256k1_fe *)(auStack_270 + 0x30));
    a_01 = r_00;
    if (8 < (int)auStack_270._88_4_) goto LAB_0012271c;
    auVar63._8_8_ = 0;
    auVar63._0_8_ = auStack_270._48_8_ * 2;
    auVar131._8_8_ = 0;
    auVar131._0_8_ = auStack_270._72_8_;
    auVar64._8_8_ = 0;
    auVar64._0_8_ = auStack_270._56_8_ * 2;
    auVar132._8_8_ = 0;
    auVar132._0_8_ = auStack_270._64_8_;
    auVar65._8_8_ = 0;
    auVar65._0_8_ = auStack_270._80_8_;
    auVar133._8_8_ = 0;
    auVar133._0_8_ = auStack_270._80_8_;
    uVar183 = SUB168(auVar65 * auVar133,0);
    auVar66._8_8_ = 0;
    auVar66._0_8_ = uVar183 & 0xfffffffffffff;
    auVar23 = auVar64 * auVar132 + auVar63 * auVar131 + auVar66 * ZEXT816(0x1000003d10);
    uVar184 = auVar23._0_8_;
    auVar168._8_8_ = 0;
    auVar168._0_8_ = uVar184 >> 0x34 | auVar23._8_8_ << 0xc;
    uVar181 = auStack_270._80_8_ * 2;
    auVar67._8_8_ = 0;
    auVar67._0_8_ = auStack_270._48_8_;
    auVar134._8_8_ = 0;
    auVar134._0_8_ = uVar181;
    auVar68._8_8_ = 0;
    auVar68._0_8_ = auStack_270._56_8_ * 2;
    auVar135._8_8_ = 0;
    auVar135._0_8_ = auStack_270._72_8_;
    auVar69._8_8_ = 0;
    auVar69._0_8_ = auStack_270._64_8_;
    auVar136._8_8_ = 0;
    auVar136._0_8_ = auStack_270._64_8_;
    auVar70._8_8_ = 0;
    auVar70._0_8_ = uVar183 >> 0x34 | SUB168(auVar65 * auVar133,8) << 0xc;
    auVar23 = auVar67 * auVar134 + auVar168 + auVar68 * auVar135 + auVar69 * auVar136 +
              auVar70 * ZEXT816(0x1000003d10);
    uStack_118 = auVar23._0_8_;
    auVar169._8_8_ = 0;
    auVar169._0_8_ = uStack_118 >> 0x34 | auVar23._8_8_ << 0xc;
    uStack_120 = (uStack_118 & 0xfffffffffffff) >> 0x30;
    uStack_118 = uStack_118 & 0xffffffffffff;
    auVar71._8_8_ = 0;
    auVar71._0_8_ = auStack_270._48_8_;
    auVar137._8_8_ = 0;
    auVar137._0_8_ = auStack_270._48_8_;
    auVar72._8_8_ = 0;
    auVar72._0_8_ = auStack_270._56_8_;
    auVar138._8_8_ = 0;
    auVar138._0_8_ = uVar181;
    auVar73._8_8_ = 0;
    auVar73._0_8_ = auStack_270._64_8_ * 2;
    auVar139._8_8_ = 0;
    auVar139._0_8_ = auStack_270._72_8_;
    auVar23 = auVar72 * auVar138 + auVar169 + auVar73 * auVar139;
    uVar183 = auVar23._0_8_;
    auVar171._8_8_ = 0;
    auVar171._0_8_ = uVar183 >> 0x34 | auVar23._8_8_ << 0xc;
    auVar140._8_8_ = 0;
    auVar140._0_8_ = (uVar183 & 0xfffffffffffff) << 4 | uStack_120;
    auVar23 = auVar71 * auVar137 + ZEXT816(0x1000003d1) * auVar140;
    uVar183 = auVar23._0_8_;
    (r_00->x).n[0] = uVar183 & 0xfffffffffffff;
    auVar170._8_8_ = 0;
    auVar170._0_8_ = uVar183 >> 0x34 | auVar23._8_8_ << 0xc;
    auVar74._8_8_ = 0;
    auVar74._0_8_ = auStack_270._48_8_ * 2;
    auVar141._8_8_ = 0;
    auVar141._0_8_ = auStack_270._56_8_;
    auVar75._8_8_ = 0;
    auVar75._0_8_ = auStack_270._64_8_;
    auVar142._8_8_ = 0;
    auVar142._0_8_ = uVar181;
    auVar76._8_8_ = 0;
    auVar76._0_8_ = auStack_270._72_8_;
    auVar143._8_8_ = 0;
    auVar143._0_8_ = auStack_270._72_8_;
    auVar24 = auVar75 * auVar142 + auVar171 + auVar76 * auVar143;
    uVar183 = auVar24._0_8_;
    auVar77._8_8_ = 0;
    auVar77._0_8_ = uVar183 & 0xfffffffffffff;
    auVar23 = auVar74 * auVar141 + auVar170 + auVar77 * ZEXT816(0x1000003d10);
    uVar182 = auVar23._0_8_;
    auVar173._8_8_ = 0;
    auVar173._0_8_ = uVar183 >> 0x34 | auVar24._8_8_ << 0xc;
    (r_00->x).n[1] = uVar182 & 0xfffffffffffff;
    auVar172._8_8_ = 0;
    auVar172._0_8_ = uVar182 >> 0x34 | auVar23._8_8_ << 0xc;
    auVar78._8_8_ = 0;
    auVar78._0_8_ = auStack_270._48_8_ * 2;
    auVar144._8_8_ = 0;
    auVar144._0_8_ = auStack_270._64_8_;
    auVar79._8_8_ = 0;
    auVar79._0_8_ = auStack_270._56_8_;
    auVar145._8_8_ = 0;
    auVar145._0_8_ = auStack_270._56_8_;
    auVar80._8_8_ = 0;
    auVar80._0_8_ = auStack_270._72_8_;
    auVar146._8_8_ = 0;
    auVar146._0_8_ = uVar181;
    auVar173 = auVar80 * auVar146 + auVar173;
    uVar181 = auVar173._0_8_;
    auVar81._8_8_ = 0;
    auVar81._0_8_ = uVar181 & 0xfffffffffffff;
    auVar23 = auVar78 * auVar144 + auVar172 + auVar79 * auVar145 + auVar81 * ZEXT816(0x1000003d10);
    uVar183 = auVar23._0_8_;
    (r_00->x).n[2] = uVar183 & 0xfffffffffffff;
    auVar174._8_8_ = 0;
    auVar174._0_8_ = (uVar183 >> 0x34 | auVar23._8_8_ << 0xc) + (uVar184 & 0xfffffffffffff);
    auVar82._8_8_ = 0;
    auVar82._0_8_ = uVar181 >> 0x34 | auVar173._8_8_ << 0xc;
    auVar174 = auVar82 * ZEXT816(0x1000003d10) + auVar174;
    uVar181 = auVar174._0_8_;
    (r_00->x).n[3] = uVar181 & 0xfffffffffffff;
    (r_00->x).n[4] = (uVar181 >> 0x34 | auVar174._8_8_ << 0xc) + uStack_118;
    (r_00->x).magnitude = 1;
    (r_00->x).normalized = 0;
    secp256k1_fe_verify(&r_00->x);
    secp256k1_fe_verify(&r_00->x);
    a_01 = (secp256k1_gej *)auStack_270;
    secp256k1_fe_verify((secp256k1_fe *)a_01);
    iVar178 = auStack_270._40_4_ + (r_00->x).magnitude;
    if (0x20 < iVar178) goto LAB_00122721;
    uVar175 = (r_00->x).n[1];
    uVar176 = (r_00->x).n[2];
    uVar177 = (r_00->x).n[3];
    (r_00->x).n[0] = (r_00->x).n[0] + auStack_270._0_8_;
    (r_00->x).n[1] = uVar175 + auStack_270._8_8_;
    (r_00->x).n[2] = uVar176 + auStack_270._16_8_;
    (r_00->x).n[3] = uVar177 + auStack_270._24_8_;
    puVar2 = (r_00->x).n + 4;
    *puVar2 = *puVar2 + auStack_270._32_8_;
    (r_00->x).magnitude = iVar178;
    (r_00->x).normalized = 0;
    secp256k1_fe_verify(&r_00->x);
    secp256k1_fe_verify(&r_00->x);
    a_01 = (secp256k1_gej *)(auStack_180 + 0x30);
    secp256k1_fe_verify((secp256k1_fe *)a_01);
    iVar178 = iStack_128 + (r_00->x).magnitude;
    if (0x20 < iVar178) goto LAB_00122726;
    uVar175 = (r_00->x).n[1];
    uVar176 = (r_00->x).n[2];
    uVar177 = (r_00->x).n[3];
    a_01 = (secp256k1_gej *)(auStack_180 + 0x30);
    (r_00->x).n[0] = (r_00->x).n[0] + auStack_180._48_8_;
    (r_00->x).n[1] = uVar175 + uStack_148;
    (r_00->x).n[2] = uVar176 + uStack_140;
    (r_00->x).n[3] = uVar177 + uStack_138;
    puVar2 = (r_00->x).n + 4;
    *puVar2 = *puVar2 + uStack_130;
    (r_00->x).magnitude = iVar178;
    (r_00->x).normalized = 0;
    secp256k1_fe_verify(&r_00->x);
    secp256k1_fe_verify(&r_00->x);
    secp256k1_fe_verify((secp256k1_fe *)a_01);
    iVar178 = iStack_128 + (r_00->x).magnitude;
    if (0x20 < iVar178) goto LAB_0012272b;
    uVar175 = (r_00->x).n[1];
    uVar176 = (r_00->x).n[2];
    uVar177 = (r_00->x).n[3];
    (r_00->x).n[0] = (r_00->x).n[0] + auStack_180._48_8_;
    (r_00->x).n[1] = uVar175 + uStack_148;
    (r_00->x).n[2] = uVar176 + uStack_140;
    (r_00->x).n[3] = uVar177 + uStack_138;
    puVar2 = (r_00->x).n + 4;
    *puVar2 = *puVar2 + uStack_130;
    (r_00->x).magnitude = iVar178;
    (r_00->x).normalized = 0;
    secp256k1_fe_verify(&r_00->x);
    secp256k1_fe_verify((secp256k1_fe *)(auStack_180 + 0x30));
    a_01 = r_00;
    secp256k1_fe_verify(&r_00->x);
    iVar178 = (r_00->x).magnitude + iStack_128;
    if (iVar178 < 0x21) {
      auStack_180._48_8_ = (r_00->x).n[0] + auStack_180._48_8_;
      uStack_148 = (r_00->x).n[1] + uStack_148;
      uStack_140 = (r_00->x).n[2] + uStack_140;
      uStack_138 = (r_00->x).n[3] + uStack_138;
      uStack_130 = uStack_130 + (r_00->x).n[4];
      iStack_124 = 0;
      iStack_128 = iVar178;
      secp256k1_fe_verify((secp256k1_fe *)(auStack_180 + 0x30));
      psVar1 = &r_00->y;
      secp256k1_fe_mul(psVar1,(secp256k1_fe *)(auStack_180 + 0x30),
                       (secp256k1_fe *)(auStack_270 + 0x30));
      a_01 = (secp256k1_gej *)auStack_270;
      secp256k1_fe_mul((secp256k1_fe *)a_01,(secp256k1_fe *)a_01,(secp256k1_fe *)auStack_1e0);
      secp256k1_fe_verify(psVar1);
      secp256k1_fe_verify((secp256k1_fe *)a_01);
      iVar178 = auStack_270._40_4_ + (r_00->y).magnitude;
      if (iVar178 < 0x21) {
        uVar175 = (r_00->y).n[1];
        uVar176 = (r_00->y).n[2];
        uVar177 = (r_00->y).n[3];
        (r_00->y).n[0] = (r_00->y).n[0] + auStack_270._0_8_;
        (r_00->y).n[1] = uVar175 + auStack_270._8_8_;
        (r_00->y).n[2] = uVar176 + auStack_270._16_8_;
        (r_00->y).n[3] = uVar177 + auStack_270._24_8_;
        puVar2 = (r_00->y).n + 4;
        *puVar2 = *puVar2 + auStack_270._32_8_;
        (r_00->y).magnitude = iVar178;
        (r_00->y).normalized = 0;
        secp256k1_fe_verify(psVar1);
        secp256k1_gej_verify(r_00);
        return;
      }
      goto LAB_00122735;
    }
  }
  else {
    r_00->infinity = a_00->infinity;
    a_01 = a;
    secp256k1_fe_verify(&a->x);
    if ((a->x).magnitude < 9) {
      psVar1 = (secp256k1_fe *)(auStack_110 + 0x60);
      uVar181 = (a->x).n[0];
      uVar183 = (a->x).n[1];
      uVar184 = (a->x).n[2];
      uVar182 = (a->x).n[3];
      uVar185 = (a->x).n[4];
      auVar3._8_8_ = 0;
      auVar3._0_8_ = uVar181 * 2;
      auVar83._8_8_ = 0;
      auVar83._0_8_ = uVar182;
      auVar4._8_8_ = 0;
      auVar4._0_8_ = uVar183 * 2;
      auVar84._8_8_ = 0;
      auVar84._0_8_ = uVar184;
      auVar5._8_8_ = 0;
      auVar5._0_8_ = uVar185;
      auVar85._8_8_ = 0;
      auVar85._0_8_ = uVar185;
      uVar179 = SUB168(auVar5 * auVar85,0);
      auVar6._8_8_ = 0;
      auVar6._0_8_ = uVar179 & 0xfffffffffffff;
      auVar23 = auVar4 * auVar84 + auVar3 * auVar83 + auVar6 * ZEXT816(0x1000003d10);
      uVar180 = auVar23._0_8_;
      auStack_110._48_8_ = uVar180 & 0xfffffffffffff;
      auVar147._8_8_ = 0;
      auVar147._0_8_ = uVar180 >> 0x34 | auVar23._8_8_ << 0xc;
      uVar185 = uVar185 * 2;
      auVar7._8_8_ = 0;
      auVar7._0_8_ = uVar181;
      auVar86._8_8_ = 0;
      auVar86._0_8_ = uVar185;
      auVar8._8_8_ = 0;
      auVar8._0_8_ = uVar183 * 2;
      auVar87._8_8_ = 0;
      auVar87._0_8_ = uVar182;
      auVar9._8_8_ = 0;
      auVar9._0_8_ = uVar184;
      auVar88._8_8_ = 0;
      auVar88._0_8_ = uVar184;
      auVar10._8_8_ = 0;
      auVar10._0_8_ = uVar179 >> 0x34 | SUB168(auVar5 * auVar85,8) << 0xc;
      auVar23 = auVar7 * auVar86 + auVar147 + auVar8 * auVar87 + auVar9 * auVar88 +
                auVar10 * ZEXT816(0x1000003d10);
      uVar179 = auVar23._0_8_;
      auVar148._8_8_ = 0;
      auVar148._0_8_ = uVar179 >> 0x34 | auVar23._8_8_ << 0xc;
      auStack_1e0._48_8_ = (uVar179 & 0xfffffffffffff) >> 0x30;
      auStack_180._0_8_ = uVar179 & 0xffffffffffff;
      auVar11._8_8_ = 0;
      auVar11._0_8_ = uVar181;
      auVar89._8_8_ = 0;
      auVar89._0_8_ = uVar181;
      auVar12._8_8_ = 0;
      auVar12._0_8_ = uVar183;
      auVar90._8_8_ = 0;
      auVar90._0_8_ = uVar185;
      auVar13._8_8_ = 0;
      auVar13._0_8_ = uVar184 * 2;
      auVar91._8_8_ = 0;
      auVar91._0_8_ = uVar182;
      auVar23 = auVar12 * auVar90 + auVar148 + auVar13 * auVar91;
      uVar179 = auVar23._0_8_;
      auVar150._8_8_ = 0;
      auVar150._0_8_ = uVar179 >> 0x34 | auVar23._8_8_ << 0xc;
      auVar92._8_8_ = 0;
      auVar92._0_8_ = (uVar179 & 0xfffffffffffff) << 4 | auStack_1e0._48_8_;
      auVar23 = auVar11 * auVar89 + ZEXT816(0x1000003d1) * auVar92;
      uVar179 = auVar23._0_8_;
      auStack_110._96_8_ = uVar179 & 0xfffffffffffff;
      auVar149._8_8_ = 0;
      auVar149._0_8_ = uVar179 >> 0x34 | auVar23._8_8_ << 0xc;
      auVar14._8_8_ = 0;
      auVar14._0_8_ = uVar181 * 2;
      auVar93._8_8_ = 0;
      auVar93._0_8_ = uVar183;
      auVar15._8_8_ = 0;
      auVar15._0_8_ = uVar184;
      auVar94._8_8_ = 0;
      auVar94._0_8_ = uVar185;
      auVar16._8_8_ = 0;
      auVar16._0_8_ = uVar182;
      auVar95._8_8_ = 0;
      auVar95._0_8_ = uVar182;
      auVar24 = auVar15 * auVar94 + auVar150 + auVar16 * auVar95;
      uVar179 = auVar24._0_8_;
      auVar17._8_8_ = 0;
      auVar17._0_8_ = uVar179 & 0xfffffffffffff;
      auVar23 = auVar14 * auVar93 + auVar149 + auVar17 * ZEXT816(0x1000003d10);
      uVar180 = auVar23._0_8_;
      auVar152._8_8_ = 0;
      auVar152._0_8_ = uVar179 >> 0x34 | auVar24._8_8_ << 0xc;
      auStack_110._104_8_ = uVar180 & 0xfffffffffffff;
      auVar151._8_8_ = 0;
      auVar151._0_8_ = uVar180 >> 0x34 | auVar23._8_8_ << 0xc;
      auVar18._8_8_ = 0;
      auVar18._0_8_ = uVar181 * 2;
      auVar96._8_8_ = 0;
      auVar96._0_8_ = uVar184;
      auVar19._8_8_ = 0;
      auVar19._0_8_ = uVar183;
      auVar97._8_8_ = 0;
      auVar97._0_8_ = uVar183;
      auVar20._8_8_ = 0;
      auVar20._0_8_ = uVar182;
      auVar98._8_8_ = 0;
      auVar98._0_8_ = uVar185;
      auVar152 = auVar20 * auVar98 + auVar152;
      uVar181 = auVar152._0_8_;
      auVar21._8_8_ = 0;
      auVar21._0_8_ = uVar181 & 0xfffffffffffff;
      auVar23 = auVar18 * auVar96 + auVar151 + auVar19 * auVar97 + auVar21 * ZEXT816(0x1000003d10);
      uVar183 = auVar23._0_8_;
      auStack_110._112_8_ = uVar183 & 0xfffffffffffff;
      auVar153._8_8_ = 0;
      auVar153._0_8_ = (uVar183 >> 0x34 | auVar23._8_8_ << 0xc) + auStack_110._48_8_;
      auVar22._8_8_ = 0;
      auVar22._0_8_ = uVar181 >> 0x34 | auVar152._8_8_ << 0xc;
      auVar153 = auVar22 * ZEXT816(0x1000003d10) + auVar153;
      uVar181 = auVar153._0_8_;
      auStack_110._120_8_ = uVar181 & 0xfffffffffffff;
      auStack_110._128_8_ = (uVar181 >> 0x34 | auVar153._8_8_ << 0xc) + auStack_180._0_8_;
      auStack_110._136_4_ = 1;
      auStack_110._140_4_ = 0;
      secp256k1_fe_verify(psVar1);
      secp256k1_fe_mul((secp256k1_fe *)(auStack_110 + 0x30),psVar1,&a->x);
      secp256k1_fe_mul(&r_00->x,&a_00->x,psVar1);
      secp256k1_fe_mul(&r_00->y,&a_00->y,(secp256k1_fe *)(auStack_110 + 0x30));
      (r_00->z).n[0] = 1;
      (r_00->z).n[1] = 0;
      (r_00->z).n[2] = 0;
      (r_00->z).n[3] = 0;
      (r_00->z).n[4] = 0;
      (r_00->z).magnitude = 1;
      (r_00->z).normalized = 1;
      secp256k1_fe_verify(&r_00->z);
      return;
    }
    secp256k1_gej_add_zinv_var_cold_1();
LAB_001226f9:
    secp256k1_gej_add_zinv_var_cold_14();
LAB_001226fe:
    secp256k1_gej_add_zinv_var_cold_13();
LAB_00122703:
    secp256k1_gej_add_zinv_var_cold_12();
LAB_00122708:
    secp256k1_gej_add_zinv_var_cold_11();
LAB_0012270d:
    secp256k1_gej_add_zinv_var_cold_10();
LAB_00122712:
    secp256k1_gej_add_zinv_var_cold_9();
LAB_00122717:
    secp256k1_gej_add_zinv_var_cold_8();
LAB_0012271c:
    secp256k1_gej_add_zinv_var_cold_7();
LAB_00122721:
    secp256k1_gej_add_zinv_var_cold_6();
LAB_00122726:
    secp256k1_gej_add_zinv_var_cold_5();
LAB_0012272b:
    secp256k1_gej_add_zinv_var_cold_4();
  }
  secp256k1_gej_add_zinv_var_cold_3();
LAB_00122735:
  secp256k1_gej_add_zinv_var_cold_2();
  *(undefined4 *)(a_01->z).n = 1;
  (a_01->x).magnitude = 0;
  (a_01->x).normalized = 1;
  (a_01->x).n[0] = 0;
  (a_01->x).n[1] = 0;
  (a_01->x).n[2] = 0;
  (a_01->x).n[3] = 0;
  (a_01->x).n[4] = 0;
  secp256k1_fe_verify(&a_01->x);
  (a_01->y).magnitude = 0;
  (a_01->y).normalized = 1;
  (a_01->y).n[0] = 0;
  (a_01->y).n[1] = 0;
  (a_01->y).n[2] = 0;
  (a_01->y).n[3] = 0;
  (a_01->y).n[4] = 0;
  secp256k1_fe_verify(&a_01->y);
  secp256k1_ge_verify((secp256k1_ge *)a_01);
  return;
}

Assistant:

SECP256K1_INLINE static void secp256k1_ecmult_table_get_ge_storage(secp256k1_ge *r, const secp256k1_ge_storage *pre, int n, int w) {
    secp256k1_ecmult_table_verify(n,w);
    if (n > 0) {
        secp256k1_ge_from_storage(r, &pre[(n-1)/2]);
    } else {
        secp256k1_ge_from_storage(r, &pre[(-n-1)/2]);
        secp256k1_fe_negate(&(r->y), &(r->y), 1);
    }
}